

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O0

int igsc_device_update_late_binding_config
              (igsc_device_handle *handle,uint32_t type,uint32_t flags,uint8_t *payload,
              size_t payload_size,uint32_t *cmd_status)

{
  long lVar1;
  igsc_lib_ctx *lib_ctx_00;
  uint8_t *__s;
  size_t buf_size;
  mkhi_msg_hdr *resp_header;
  uint uVar2;
  int iVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  size_t req_sz;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff288;
  undefined4 uVar6;
  igsc_log_func_t igsc_log_func_12;
  igsc_log_func_t igsc_log_func_11;
  igsc_log_func_t igsc_log_func_10;
  igsc_log_func_t igsc_log_func_9;
  igsc_log_func_t igsc_log_func_8;
  igsc_log_func_t igsc_log_func_7;
  igsc_log_func_t igsc_log_func_6;
  igsc_log_func_t igsc_log_func_5;
  igsc_log_func_t igsc_log_func_4;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  csc_heci_late_binding_req *req;
  csc_heci_late_binding_resp *resp;
  igsc_lib_ctx *lib_ctx;
  size_t buf_len;
  size_t response_len;
  size_t request_len;
  int status;
  uint32_t *cmd_status_local;
  size_t payload_size_local;
  uint8_t *payload_local;
  uint32_t flags_local;
  uint32_t type_local;
  igsc_device_handle *handle_local;
  size_t local_c20;
  size_t received_len;
  char __time_buf_23 [128];
  char __time_buf_22 [128];
  char __time_buf_21 [128];
  char __time_buf_20 [128];
  char __time_buf_19 [128];
  char __time_buf_18 [128];
  char __time_buf_17 [128];
  char __time_buf_16 [128];
  char __time_buf_15 [128];
  char __time_buf_14 [128];
  char __time_buf_13 [128];
  char __time_buf_12 [128];
  char __time_buf_11 [128];
  char __time_buf_10 [128];
  char __time_buf_9 [128];
  char __time_buf_8 [128];
  char __time_buf_7 [128];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffff288 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c20 = 0;
  if ((((handle == (igsc_device_handle *)0x0) || (handle->ctx == (igsc_lib_ctx *)0x0)) ||
      (cmd_status == (uint32_t *)0x0)) || ((payload == (uint8_t *)0x0 || (payload_size == 0)))) {
    handle_local._4_4_ = 3;
  }
  else {
    lib_ctx_00 = handle->ctx;
    if ((type == 1) || (type == 2)) {
      if ((flags & 0xfffffffe) == 0) {
        uVar2 = igsc_get_log_level();
        if (uVar2 != 0) {
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(__time_buf_5 + 0x78,0x80);
            syslog(7,"%s: IGSC: (%s:%s():%d) in late binding, initializing driver\n",pcVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_device_update_late_binding_config",0x69b);
          }
          else {
            p_Var4 = igsc_get_log_callback_func();
            pcVar5 = gsc_time(__time_buf_5 + 0x78,0x80);
            (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,
                      "%s: IGSC: (%s:%s():%d) in late binding, initializing driver\n",pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_device_update_late_binding_config",0x69b);
          }
        }
        handle_local._4_4_ = gsc_driver_init(lib_ctx_00,&GUID_METEE_MKHI);
        if (handle_local._4_4_ == 0) {
          __s = lib_ctx_00->working_buffer;
          buf_size = lib_ctx_00->working_buffer_length;
          if (buf_size - 0x18 < payload_size) {
            p_Var4 = igsc_get_log_callback_func();
            if (p_Var4 == (igsc_log_func_t)0x0) {
              pcVar5 = gsc_time(__time_buf_8 + 0x78,0x80);
              syslog(3,"%s: IGSC: (%s:%s():%d) Payload size is too big %zu\n",pcVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                     "igsc_device_update_late_binding_config",0x6a8,payload_size);
            }
            else {
              p_Var4 = igsc_get_log_callback_func();
              pcVar5 = gsc_time(__time_buf_9 + 0x78,0x80);
              (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Payload size is too big %zu\n",
                        pcVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                        "igsc_device_update_late_binding_config",0x6a8,payload_size);
            }
            request_len._4_4_ = 3;
          }
          else {
            req_sz = payload_size + 0x18;
            resp_header = (mkhi_msg_hdr *)lib_ctx_00->working_buffer;
            request_len._4_4_ = gsc_fwu_buffer_validate(lib_ctx_00,req_sz,0x14);
            if (request_len._4_4_ == 0) {
              memset(__s,0,req_sz);
              __s[1] = __s[1] & 0x80 | 0x12;
              *__s = '0';
              *(uint32_t *)(__s + 4) = type;
              *(uint32_t *)(__s + 8) = flags;
              *(int *)(__s + 0x14) = (int)payload_size;
              iVar3 = gsc_memcpy_s(__s + 0x18,buf_size - 0x18,payload,payload_size);
              if (iVar3 == 0) {
                request_len._4_4_ =
                     gsc_tee_command(lib_ctx_00,__s,req_sz,resp_header,buf_size,&local_c20);
                if (request_len._4_4_ == 0) {
                  if (local_c20 < 0x14) {
                    p_Var4 = igsc_get_log_callback_func();
                    if (p_Var4 == (igsc_log_func_t)0x0) {
                      pcVar5 = gsc_time(__time_buf_14 + 0x78,0x80);
                      syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                             ,"igsc_device_update_late_binding_config",0x6cd,local_c20);
                    }
                    else {
                      p_Var4 = igsc_get_log_callback_func();
                      pcVar5 = gsc_time(__time_buf_15 + 0x78,0x80);
                      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                ,"igsc_device_update_late_binding_config",0x6cd,local_c20);
                    }
                    request_len._4_4_ = 6;
                  }
                  else {
                    request_len._4_4_ =
                         mkhi_heci_validate_response_header(lib_ctx_00,resp_header,0x12);
                    if (request_len._4_4_ == 0) {
                      if (local_c20 == 0x14) {
                        if (resp_header[1] == (mkhi_msg_hdr)type) {
                          if ((resp_header[2] == (mkhi_msg_hdr)0x0) &&
                             (resp_header[3] == (mkhi_msg_hdr)0x0)) {
                            uVar2 = igsc_get_log_level();
                            if (uVar2 != 0) {
                              p_Var4 = igsc_get_log_callback_func();
                              if (p_Var4 == (igsc_log_func_t)0x0) {
                                pcVar5 = gsc_time((char *)&received_len,0x80);
                                syslog(7,"%s: IGSC: (%s:%s():%d) success, status %u\n",pcVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                       ,"igsc_device_update_late_binding_config",0x6f0,
                                       CONCAT44(uVar6,resp_header[4]));
                              }
                              else {
                                p_Var4 = igsc_get_log_callback_func();
                                pcVar5 = gsc_time((char *)&received_len,0x80);
                                (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,
                                          "%s: IGSC: (%s:%s():%d) success, status %u\n",pcVar5,
                                          "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                          ,"igsc_device_update_late_binding_config",0x6f0,
                                          CONCAT44(uVar6,resp_header[4]));
                              }
                            }
                            *cmd_status = (uint32_t)resp_header[4];
                            request_len._4_4_ = 0;
                          }
                          else {
                            p_Var4 = igsc_get_log_callback_func();
                            if (p_Var4 == (igsc_log_func_t)0x0) {
                              pcVar5 = gsc_time(__time_buf_22 + 0x78,0x80);
                              syslog(3,
                                     "%s: IGSC: (%s:%s():%d) HECI message response is leaking data\n"
                                     ,pcVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                     ,"igsc_device_update_late_binding_config",0x6eb);
                            }
                            else {
                              p_Var4 = igsc_get_log_callback_func();
                              pcVar5 = gsc_time(__time_buf_23 + 0x78,0x80);
                              (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                        "%s: IGSC: (%s:%s():%d) HECI message response is leaking data\n"
                                        ,pcVar5,
                                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                        ,"igsc_device_update_late_binding_config",0x6eb);
                            }
                            request_len._4_4_ = 6;
                          }
                        }
                        else {
                          p_Var4 = igsc_get_log_callback_func();
                          if (p_Var4 == (igsc_log_func_t)0x0) {
                            pcVar5 = gsc_time(__time_buf_20 + 0x78,0x80);
                            syslog(3,
                                   "%s: IGSC: (%s:%s():%d) Received wrong payload type in response from firmware %u, expected %u\n"
                                   ,pcVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                   ,"igsc_device_update_late_binding_config",0x6e4,
                                   CONCAT44(uVar6,resp_header[1]),type);
                          }
                          else {
                            p_Var4 = igsc_get_log_callback_func();
                            pcVar5 = gsc_time(__time_buf_21 + 0x78,0x80);
                            (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                      "%s: IGSC: (%s:%s():%d) Received wrong payload type in response from firmware %u, expected %u\n"
                                      ,pcVar5,
                                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                      ,"igsc_device_update_late_binding_config",0x6e4,
                                      CONCAT44(uVar6,resp_header[1]),type);
                          }
                          request_len._4_4_ = 6;
                        }
                      }
                      else {
                        p_Var4 = igsc_get_log_callback_func();
                        if (p_Var4 == (igsc_log_func_t)0x0) {
                          pcVar5 = gsc_time(__time_buf_18 + 0x78,0x80);
                          syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",
                                 pcVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                 ,"igsc_device_update_late_binding_config",0x6dc,local_c20);
                        }
                        else {
                          p_Var4 = igsc_get_log_callback_func();
                          pcVar5 = gsc_time(__time_buf_19 + 0x78,0x80);
                          (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                    "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",
                                    pcVar5,
                                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                    ,"igsc_device_update_late_binding_config",0x6dc,local_c20);
                        }
                        request_len._4_4_ = 6;
                      }
                    }
                    else {
                      p_Var4 = igsc_get_log_callback_func();
                      if (p_Var4 == (igsc_log_func_t)0x0) {
                        pcVar5 = gsc_time(__time_buf_16 + 0x78,0x80);
                        syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n",
                               pcVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                               ,"igsc_device_update_late_binding_config",0x6d6,
                               CONCAT44(uVar6,request_len._4_4_));
                      }
                      else {
                        p_Var4 = igsc_get_log_callback_func();
                        pcVar5 = gsc_time(__time_buf_17 + 0x78,0x80);
                        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                  "%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n",
                                  pcVar5,
                                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                  ,"igsc_device_update_late_binding_config",0x6d6,
                                  CONCAT44(uVar6,request_len._4_4_));
                      }
                    }
                  }
                }
                else {
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(__time_buf_12 + 0x78,0x80);
                    syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n",pcVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                           ,"igsc_device_update_late_binding_config",0x6c7,
                           CONCAT44(uVar6,request_len._4_4_));
                  }
                  else {
                    p_Var4 = igsc_get_log_callback_func();
                    pcVar5 = gsc_time(__time_buf_13 + 0x78,0x80);
                    (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                              "%s: IGSC: (%s:%s():%d) Invalid HECI message response (%d)\n",pcVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                              ,"igsc_device_update_late_binding_config",0x6c7,
                              CONCAT44(uVar6,request_len._4_4_));
                  }
                }
              }
              else {
                p_Var4 = igsc_get_log_callback_func();
                if (p_Var4 == (igsc_log_func_t)0x0) {
                  pcVar5 = gsc_time(__time_buf_10 + 0x78,0x80);
                  syslog(3,"%s: IGSC: (%s:%s():%d) Copy of payload data failed\n",pcVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                         "igsc_device_update_late_binding_config",0x6bf);
                }
                else {
                  p_Var4 = igsc_get_log_callback_func();
                  pcVar5 = gsc_time(__time_buf_11 + 0x78,0x80);
                  (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                            "%s: IGSC: (%s:%s():%d) Copy of payload data failed\n",pcVar5,
                            "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                            ,"igsc_device_update_late_binding_config",0x6bf);
                }
                request_len._4_4_ = 1;
              }
            }
          }
          gsc_driver_deinit(lib_ctx_00);
          handle_local._4_4_ = request_len._4_4_;
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(__time_buf_6 + 0x78,0x80);
            syslog(3,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_device_update_late_binding_config",0x6a0,CONCAT44(uVar6,handle_local._4_4_)
                  );
          }
          else {
            p_Var4 = igsc_get_log_callback_func();
            pcVar5 = gsc_time(__time_buf_7 + 0x78,0x80);
            (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                      "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_device_update_late_binding_config",0x6a0,
                      CONCAT44(uVar6,handle_local._4_4_));
          }
        }
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(__time_buf_3 + 0x78,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) Wrong flags value 0x%x\n",pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_device_update_late_binding_config",0x697,CONCAT44(uVar6,flags));
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(__time_buf_4 + 0x78,0x80);
          (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Wrong flags value 0x%x\n",pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_device_update_late_binding_config",0x697,CONCAT44(uVar6,flags));
        }
        handle_local._4_4_ = 3;
      }
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(__time_buf_1 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Wrong payload type %u\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_device_update_late_binding_config",0x691,CONCAT44(uVar6,type));
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(__time_buf_2 + 0x78,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Wrong payload type %u\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_device_update_late_binding_config",0x691,CONCAT44(uVar6,type));
      }
      handle_local._4_4_ = 3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return handle_local._4_4_;
}

Assistant:

int igsc_device_update_late_binding_config(IN struct  igsc_device_handle *handle,
                                           IN uint32_t type, /* enum csc_late_binding_type */
                                           IN uint32_t flags,
                                           IN uint8_t *payload, IN size_t payload_size,
                                           OUT uint32_t *cmd_status) /* enum csc_late_binding_status */
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx *lib_ctx;

    struct csc_heci_late_binding_resp *resp;
    struct csc_heci_late_binding_req *req;

    if (!handle || !handle->ctx || cmd_status == NULL || payload == NULL || payload_size == 0)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    if (type != CSC_LATE_BINDING_TYPE_FAN_TABLE && type != CSC_LATE_BINDING_TYPE_VR_CONFIG)
    {
        gsc_error("Wrong payload type %u\n", type);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if ((flags & ~(uint32_t)CSC_LATE_BINDING_FLAGS_IS_PERSISTENT_MASK) != 0)
    {
        gsc_error("Wrong flags value 0x%x\n", flags);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    gsc_debug("in late binding, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_MKHI);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct csc_heci_late_binding_req *)lib_ctx->working_buffer;
    buf_len = lib_ctx->working_buffer_length;
    if (payload_size > buf_len - sizeof(*req))
    {
        gsc_error("Payload size is too big %zu\n", payload_size);
        status = IGSC_ERROR_INVALID_PARAMETER;
        goto exit;
    }

    request_len = sizeof(*req) + payload_size;
    resp = (struct csc_heci_late_binding_resp *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.command = GFX_SRV_MKHI_LATE_BINDING_CMD;
    req->header.group_id = MKHI_GROUP_ID_GFX_SRV;
    req->type = type;
    req->flags = flags;
    req->payload_size = (uint32_t)payload_size;
    if (gsc_memcpy_s(req->payload, buf_len - sizeof(*req), payload, payload_size))
    {
        gsc_error("Copy of payload data failed\n");
        status = IGSC_ERROR_INTERNAL;
        goto exit;
    }

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response (%d)\n", status);
        goto exit;
    }

    if (received_len < sizeof(*resp))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    status = mkhi_heci_validate_response_header(lib_ctx, &resp->header,
                                                GFX_SRV_MKHI_LATE_BINDING_CMD);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response (%d)\n", status);
        goto exit;
    }

    if (received_len != response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->type != type)
    {
        gsc_error("Received wrong payload type in response from firmware %u, expected %u\n",
                  resp->type, type);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->reserved[0] != 0 || resp->reserved[1] != 0 )
    {
        gsc_error("HECI message response is leaking data\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    gsc_debug("success, status %u\n", resp->status);

    *cmd_status = resp->status;
    status = IGSC_SUCCESS;

exit:
    gsc_driver_deinit(lib_ctx);

    return status;

}